

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int create_intarray(lua_State *L)

{
  int iVar1;
  lua_Integer initial_value;
  lua_Integer lVar2;
  
  iVar1 = lua_gettop(L);
  if (iVar1 == 2) {
    initial_value = luaL_checkinteger(L,2);
  }
  else {
    initial_value = 0;
  }
  lVar2 = luaL_checkinteger(L,1);
  ravi_create_integer_array(L,(int)lVar2,initial_value);
  return 1;
}

Assistant:

static int create_intarray(lua_State *L) {
  int n = lua_gettop(L);
  lua_Integer init_value = (n == 2 ? luaL_checkinteger(L, 2) : 0);
  int size = (int)luaL_checkinteger(L, 1);
  ravi_create_integer_array(L, size, init_value);
  return 1;
}